

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

usize hash(String *str)

{
  usize uVar1;
  char *pcVar2;
  char *s;
  usize hashCode;
  usize len;
  String *str_local;
  
  uVar1 = String::length(str);
  pcVar2 = String::operator_cast_to_char_(str);
  return (long)pcVar2[uVar1 - (uVar1 != 0)] ^
         ((long)pcVar2[uVar1 >> 1] ^ ((long)*pcVar2 ^ uVar1 * 0x41a7) * 0x41a7) * 0x41a7;
}

Assistant:

inline usize hash(const String& str)
{
  usize len;
  usize hashCode = (len = str.length());
  const char* s = str;
  hashCode *= 16807;
  hashCode ^= s[0];
  hashCode *= 16807;
  hashCode ^= s[len / 2];
  hashCode *= 16807;
  hashCode ^= s[len - (len != 0)];
  return hashCode;
}